

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa.c
# Opt level: O2

int mbedtls_ecdsa_read_signature
              (mbedtls_ecdsa_context *ctx,uchar *hash,size_t hlen,uchar *sig,size_t slen)

{
  int iVar1;
  uchar *end;
  uchar *p;
  size_t len;
  mbedtls_mpi s;
  mbedtls_mpi r;
  
  end = sig + slen;
  p = sig;
  mbedtls_mpi_init(&r);
  mbedtls_mpi_init(&s);
  iVar1 = mbedtls_asn1_get_tag(&p,end,&len,0x30);
  if (iVar1 == 0) {
    iVar1 = -0x4fe6;
    if (p + len != end) goto LAB_0016bc1a;
    iVar1 = mbedtls_asn1_get_mpi(&p,end,&r);
    if ((iVar1 == 0) && (iVar1 = mbedtls_asn1_get_mpi(&p,end,&s), iVar1 == 0)) {
      iVar1 = mbedtls_ecdsa_verify(&ctx->grp,hash,hlen,&ctx->Q,&r,&s);
      if (iVar1 == 0) {
        iVar1 = -0x4c00;
        if (p == end) {
          iVar1 = 0;
        }
      }
      goto LAB_0016bc1a;
    }
  }
  iVar1 = iVar1 + -0x4f80;
LAB_0016bc1a:
  mbedtls_mpi_free(&r);
  mbedtls_mpi_free(&s);
  return iVar1;
}

Assistant:

int mbedtls_ecdsa_read_signature( mbedtls_ecdsa_context *ctx,
                          const unsigned char *hash, size_t hlen,
                          const unsigned char *sig, size_t slen )
{
    int ret;
    unsigned char *p = (unsigned char *) sig;
    const unsigned char *end = sig + slen;
    size_t len;
    mbedtls_mpi r, s;

    mbedtls_mpi_init( &r );
    mbedtls_mpi_init( &s );

    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
                    MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
    {
        ret += MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
        goto cleanup;
    }

    if( p + len != end )
    {
        ret = MBEDTLS_ERR_ECP_BAD_INPUT_DATA +
              MBEDTLS_ERR_ASN1_LENGTH_MISMATCH;
        goto cleanup;
    }

    if( ( ret = mbedtls_asn1_get_mpi( &p, end, &r ) ) != 0 ||
        ( ret = mbedtls_asn1_get_mpi( &p, end, &s ) ) != 0 )
    {
        ret += MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
        goto cleanup;
    }

    if( ( ret = mbedtls_ecdsa_verify( &ctx->grp, hash, hlen,
                              &ctx->Q, &r, &s ) ) != 0 )
        goto cleanup;

    if( p != end )
        ret = MBEDTLS_ERR_ECP_SIG_LEN_MISMATCH;

cleanup:
    mbedtls_mpi_free( &r );
    mbedtls_mpi_free( &s );

    return( ret );
}